

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionObject * __thiscall
btCollisionWorldImporter::getCollisionObjectByName(btCollisionWorldImporter *this,char *name)

{
  btCollisionObject **ppbVar1;
  btCollisionObject *pbVar2;
  btHashString local_20;
  
  btHashString::btHashString(&local_20,name);
  ppbVar1 = btHashMap<btHashString,_btCollisionObject_*>::find(&this->m_nameColObjMap,&local_20);
  if ((ppbVar1 == (btCollisionObject **)0x0) ||
     (pbVar2 = *ppbVar1, pbVar2 == (btCollisionObject *)0x0)) {
    pbVar2 = (btCollisionObject *)0x0;
  }
  return pbVar2;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::getCollisionObjectByName(const char* name)
{
	btCollisionObject** bodyPtr = m_nameColObjMap.find(name);
	if (bodyPtr && *bodyPtr)
	{
		return *bodyPtr;
	}
	return 0;
}